

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

Sampler * glu::mapGLSampler(Sampler *__return_storage_ptr__,deUint32 wrapS,deUint32 wrapT,
                           deUint32 wrapR,deUint32 minFilter,deUint32 magFilter)

{
  WrapMode wrapS_;
  WrapMode wrapT_;
  WrapMode wrapR_;
  FilterMode minFilter_;
  FilterMode magFilter_;
  Vector<float,_4> local_2c;
  deUint32 local_1c;
  deUint32 local_18;
  deUint32 magFilter_local;
  deUint32 minFilter_local;
  deUint32 wrapR_local;
  deUint32 wrapT_local;
  deUint32 wrapS_local;
  
  local_1c = magFilter;
  local_18 = minFilter;
  magFilter_local = wrapR;
  minFilter_local = wrapT;
  wrapR_local = wrapS;
  wrapS_ = mapGLWrapMode(wrapS);
  wrapT_ = mapGLWrapMode(minFilter_local);
  wrapR_ = mapGLWrapMode(magFilter_local);
  minFilter_ = mapGLMinFilterMode(local_18);
  magFilter_ = mapGLMagFilterMode(local_1c);
  tcu::Vector<float,_4>::Vector(&local_2c,0.0);
  tcu::Sampler::Sampler
            (__return_storage_ptr__,wrapS_,wrapT_,wrapR_,minFilter_,magFilter_,0.0,true,
             COMPAREMODE_NONE,0,&local_2c,false,MODE_DEPTH);
  return __return_storage_ptr__;
}

Assistant:

tcu::Sampler mapGLSampler (deUint32 wrapS, deUint32 wrapT, deUint32 wrapR, deUint32 minFilter, deUint32 magFilter)
{
	return tcu::Sampler(mapGLWrapMode(wrapS), mapGLWrapMode(wrapT), mapGLWrapMode(wrapR),
						mapGLMinFilterMode(minFilter), mapGLMagFilterMode(magFilter),
						0.0f /* lod threshold */,
						true /* normalized coords */,
						tcu::Sampler::COMPAREMODE_NONE /* no compare */,
						0 /* compare channel */,
						tcu::Vec4(0.0f) /* border color, not used */);
}